

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_control.c
# Opt level: O2

int volume_control_segment_mix(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  uint32_t i;
  ulong uVar3;
  float fVar4;
  uint32_t samples;
  float *out;
  float *in;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  puVar2 = (undefined8 *)segment->data;
  fVar4 = *(float *)(puVar2 + 4);
  fVar1 = *(float *)((long)puVar2 + 0x24);
  local_48 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar1) & 0x3f800000 |
                                   (uint)(1.0 - fVar1) & -(uint)(0.0 < fVar1)) * fVar4));
  local_38 = ZEXT416(~-(uint)(fVar1 < 0.0) & 0x3f800000 | (uint)(fVar1 + 1.0) & -(uint)(fVar1 < 0.0)
                    );
  mixed_buffer_request_read(&in,&samples,(mixed_buffer *)*puVar2);
  mixed_buffer_request_write(&out,&samples,(mixed_buffer *)puVar2[2]);
  for (uVar3 = 0; samples != uVar3; uVar3 = uVar3 + 1) {
    out[uVar3] = in[uVar3] * (float)local_48._0_4_;
  }
  fVar4 = fVar4 * (float)local_38._0_4_;
  mixed_buffer_finish_read(samples,(mixed_buffer *)*puVar2);
  mixed_buffer_finish_write(samples,(mixed_buffer *)puVar2[2]);
  mixed_buffer_request_read(&in,&samples,(mixed_buffer *)puVar2[1]);
  mixed_buffer_request_write(&out,&samples,(mixed_buffer *)puVar2[3]);
  for (uVar3 = 0; samples != uVar3; uVar3 = uVar3 + 1) {
    out[uVar3] = in[uVar3] * fVar4;
  }
  mixed_buffer_finish_read(samples,(mixed_buffer *)puVar2[1]);
  mixed_buffer_finish_write(samples,(mixed_buffer *)puVar2[3]);
  return 1;
}

Assistant:

int volume_control_segment_mix(struct mixed_segment *segment){
  struct volume_control_segment_data *data = (struct volume_control_segment_data *)segment->data;
  float lvolume = data->volume * ((0.0<data->pan)?(1.0f-data->pan):1.0f);
  float rvolume = data->volume * ((data->pan<0.0)?(1.0f+data->pan):1.0f);
  float *restrict in, *restrict out;
  uint32_t samples;

  mixed_buffer_request_read(&in, &samples, data->in[MIXED_LEFT]);
  mixed_buffer_request_write(&out, &samples, data->out[MIXED_LEFT]);
  for(uint32_t i=0; i<samples; ++i)
    out[i] = in[i]*lvolume;
  mixed_buffer_finish_read(samples, data->in[MIXED_LEFT]);
  mixed_buffer_finish_write(samples, data->out[MIXED_LEFT]);
  
  mixed_buffer_request_read(&in, &samples, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&out, &samples, data->out[MIXED_RIGHT]);
  for(uint32_t i=0; i<samples; ++i)
    out[i] = in[i]*rvolume;
  mixed_buffer_finish_read(samples, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(samples, data->out[MIXED_RIGHT]);
  return 1;
}